

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_expectNoCallInScopeThatHappened_Test::
TEST_MockCallTest_expectNoCallInScopeThatHappened_Test
          (TEST_MockCallTest_expectNoCallInScopeThatHappened_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002de6c8;
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "scope::lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope::lazy", expectations);

    mock("scope").expectNoCall("lazy");
    mock("scope").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}